

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::isolatePostModifier(string *unit_string,string *modifier)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type divloc2;
  size_type divloc;
  bool skip;
  size_type nspace;
  size_type kloc;
  size_type modfind;
  bool modified;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  size_type in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb7;
  undefined1 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  bool local_31;
  bool local_11;
  
  local_11 = false;
  sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_ffffffffffffffc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffb8,
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (sVar6 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    find_last_not_of(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    uVar11 = true;
    if (sVar7 != 0) {
      in_stack_ffffffffffffffa8 = sVar7;
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (in_RDI);
      uVar11 = true;
      if (in_stack_ffffffffffffffa8 < sVar8) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        uVar11 = *pvVar9 != ' ';
      }
    }
    local_31 = (bool)uVar11;
    if ((bool)uVar11 == false) {
      pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(1,CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                          CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      bVar5 = isOperator(*pvVar9);
      in_stack_ffffffffffffffa6 = true;
      in_stack_ffffffffffffffa7 = bVar5;
      if (!bVar5) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (ulong)CONCAT16(1,CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa6 = isOperator(*pvVar9);
      }
      bVar1 = (bool)in_stack_ffffffffffffffa6 != false;
      in_stack_ffffffffffffffa5 = true;
      if (!bVar5 && !bVar1) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(1,CONCAT14(in_stack_ffffffffffffffa4,
                                                                  CONCAT13(in_stack_ffffffffffffffa3
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa5 = *pvVar9 == ')';
      }
      bVar2 = (bool)in_stack_ffffffffffffffa5 != false;
      in_stack_ffffffffffffffa4 = true;
      if ((!bVar5 && !bVar1) && !bVar2) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(1,CONCAT13(in_stack_ffffffffffffffa3
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa4 = *pvVar9 == '-';
      }
      bVar3 = (bool)in_stack_ffffffffffffffa4 != false;
      in_stack_ffffffffffffffa3 = true;
      if (((!bVar5 && !bVar1) && !bVar2) && !bVar3) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(1,CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa3 = *pvVar9 == ')';
      }
      bVar4 = (bool)in_stack_ffffffffffffffa3 != false;
      in_stack_ffffffffffffffa2 = true;
      if ((((!bVar5 && !bVar1) && !bVar2) && !bVar3) && !bVar4) {
        pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(1,
                                                  in_stack_ffffffffffffffa0)))))),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa2 = *pvVar9 == '-';
      }
      local_31 = ((((bVar5 || bVar1) || bVar2) || bVar3) || bVar4) ||
                 (bool)in_stack_ffffffffffffffa2 != false;
    }
    if ((local_31 == false) &&
       (sVar10 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            in_stack_ffffffffffffff9f,0x7a97e0), sVar10 < sVar6)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar11,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 CONCAT17(in_stack_ffffffffffffffa7,
                          CONCAT16(in_stack_ffffffffffffffa6,
                                   CONCAT15(in_stack_ffffffffffffffa5,
                                            CONCAT14(in_stack_ffffffffffffffa4,
                                                     CONCAT13(in_stack_ffffffffffffffa3,
                                                              CONCAT12(in_stack_ffffffffffffffa2,
                                                                       in_stack_ffffffffffffffa0))))
                                  )),in_stack_ffffffffffffff9f);
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,
                                              CONCAT15(in_stack_ffffffffffffffa5,
                                                       CONCAT14(in_stack_ffffffffffffffa4,
                                                                CONCAT13(in_stack_ffffffffffffffa3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                            in_stack_ffffffffffffff9f,0x7a982a);
      if (sVar8 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar11,in_stack_ffffffffffffffb0),
                   (char)(in_stack_ffffffffffffffa8 >> 0x38));
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar11,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,
                                     CONCAT15(in_stack_ffffffffffffffa5,
                                              CONCAT14(in_stack_ffffffffffffffa4,
                                                       CONCAT13(in_stack_ffffffffffffffa3,
                                                                CONCAT12(in_stack_ffffffffffffffa2,
                                                                         in_stack_ffffffffffffffa0))
                                                      )))),in_stack_ffffffffffffff9f);
      }
      local_11 = true;
      local_31 = sVar8 < sVar7 + 1;
    }
    if (local_31 == false) {
      pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(in_stack_ffffffffffffffa6,
                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                     CONCAT14(in_stack_ffffffffffffffa4,
                                                              CONCAT13(in_stack_ffffffffffffffa3,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)))))),
                          CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      *pvVar9 = '*';
      local_11 = true;
    }
  }
  return local_11;
}

Assistant:

static bool
    isolatePostModifier(std::string& unit_string, const std::string& modifier)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto kloc = unit_string.find_last_not_of(' ', modfind - 1);

        auto nspace = unit_string.find_last_of(" */", kloc);
        auto skip =
            (nspace == 0 || (nspace >= unit_string.size()) ||
             unit_string[nspace] != ' ');
        if (!skip) {
            skip |= skip || isOperator(unit_string[nspace + 1]);
            skip |= skip || isOperator(unit_string[nspace - 1]);
            skip |= skip || unit_string[nspace + 1] == ')';
            skip |= skip || unit_string[nspace + 1] == '-';
            skip |= skip || unit_string[nspace - 1] == ')';
            skip |= skip || unit_string[nspace - 1] == '-';
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                auto divloc2 = unit_string.find_first_of('/', modfind + 1);
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2, 1, ')');
                } else {
                    unit_string.push_back(')');
                }
                modified = true;
                ++nspace;
                skip |= (divloc2 < nspace);
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}